

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

int xmlParseCtxtExternalEntity(xmlParserCtxtPtr ctx,xmlChar *URL,xmlChar *ID,xmlNodePtr *lst)

{
  xmlParserErrors xVar1;
  xmlParserCtxtPtr user_data;
  
  if (ctx != (xmlParserCtxtPtr)0x0) {
    user_data = (xmlParserCtxtPtr)0x0;
    if ((xmlParserCtxtPtr)ctx->userData != ctx) {
      user_data = (xmlParserCtxtPtr)ctx->userData;
    }
    xVar1 = xmlParseExternalEntityPrivate
                      (ctx->myDoc,ctx,ctx->sax,user_data,ctx->depth + 1,URL,ID,lst);
    return xVar1;
  }
  return -1;
}

Assistant:

int
xmlParseCtxtExternalEntity(xmlParserCtxtPtr ctx, const xmlChar *URL,
	               const xmlChar *ID, xmlNodePtr *lst) {
    void *userData;

    if (ctx == NULL) return(-1);
    /*
     * If the user provided their own SAX callbacks, then reuse the
     * userData callback field, otherwise the expected setup in a
     * DOM builder is to have userData == ctxt
     */
    if (ctx->userData == ctx)
        userData = NULL;
    else
        userData = ctx->userData;
    return xmlParseExternalEntityPrivate(ctx->myDoc, ctx, ctx->sax,
                                         userData, ctx->depth + 1,
                                         URL, ID, lst);
}